

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t extended_mpu_ap_bits(uint32_t val)

{
  undefined4 local_18;
  undefined4 local_14;
  int i;
  uint32_t mask;
  uint32_t ret;
  uint32_t val_local;
  
  i = 0;
  local_14 = 3;
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 2) {
    i = (val & local_14) << ((byte)local_18 & 0x1f) | i;
    local_14 = local_14 << 2;
  }
  return i;
}

Assistant:

static uint32_t extended_mpu_ap_bits(uint32_t val)
{
    uint32_t ret;
    uint32_t mask;
    int i;
    ret = 0;
    mask = 3;
    for (i = 0; i < 16; i += 2) {
        ret |= (val & mask) << i;
        mask <<= 2;
    }
    return ret;
}